

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::toString<long_double>(IsNaN<long_double> in)

{
  char *__dest;
  String *in_RDI;
  char *pcVar1;
  longdouble in_stack_00000008;
  byte in_stack_00000018;
  anon_union_24_2_13149d16_for_String_3 local_b8;
  anon_union_24_2_13149d16_for_String_3 local_a0;
  anon_union_24_2_13149d16_for_String_3 local_88;
  anon_union_24_2_13149d16_for_String_3 local_70;
  anon_union_24_2_13149d16_for_String_3 local_58;
  anon_union_24_2_13149d16_for_String_3 local_40;
  longdouble local_24;
  
  pcVar1 = "";
  if (in_stack_00000018 != 0) {
    pcVar1 = "! ";
  }
  __dest = String::allocate((String *)&local_70.data,(uint)in_stack_00000018 * 2);
  memcpy(__dest,pcVar1,(ulong)((uint)in_stack_00000018 * 2));
  pcVar1 = String::allocate((String *)&local_88.data,7);
  builtin_strncpy(pcVar1,"IsNaN( ",7);
  operator+((String *)&local_58.data,(String *)&local_70.data,(String *)&local_88.data);
  local_24 = in_stack_00000008;
  detail::tlssPush();
  std::ostream::_M_insert<long_double>(local_24);
  detail::tlssPop();
  operator+((String *)&local_40.data,(String *)&local_58.data,(String *)&local_a0.data);
  pcVar1 = String::allocate((String *)&local_b8.data,2);
  pcVar1[0] = ' ';
  pcVar1[1] = ')';
  operator+(in_RDI,(String *)&local_40.data,(String *)&local_b8.data);
  if ((local_b8.buf[0x17] < '\0') && (local_b8.data.ptr != (char *)0x0)) {
    operator_delete__(local_b8.data.ptr);
  }
  if ((local_40.buf[0x17] < '\0') && (local_40.data.ptr != (char *)0x0)) {
    operator_delete__(local_40.data.ptr);
  }
  if ((local_a0.buf[0x17] < '\0') && (local_a0.data.ptr != (char *)0x0)) {
    operator_delete__(local_a0.data.ptr);
  }
  if ((local_58.buf[0x17] < '\0') && (local_58.data.ptr != (char *)0x0)) {
    operator_delete__(local_58.data.ptr);
  }
  if ((local_88.buf[0x17] < '\0') && (local_88.data.ptr != (char *)0x0)) {
    operator_delete__(local_88.data.ptr);
  }
  if ((local_70.buf[0x17] < '\0') && (local_70.data.ptr != (char *)0x0)) {
    operator_delete__(local_70.data.ptr);
  }
  return in_RDI;
}

Assistant:

String toString(IsNaN<F> in) { return String(in.flipped ? "! " : "") + "IsNaN( " + doctest::toString(in.value) + " )"; }